

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O2

bool fileExists(wstring *strFilename)

{
  int iVar1;
  string utf8;
  stat stFileInfo;
  string local_c0;
  stat local_a0;
  
  convertWStringToUtf8(&local_c0,strFilename);
  iVar1 = stat(local_c0._M_dataplus._M_p,&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  return iVar1 == 0;
}

Assistant:

bool fileExists(const std::wstring& strFilename)
{
#ifdef _WIN32
	struct _stat stFileInfo;
	int intStat = _wstat(strFilename.c_str(),&stFileInfo);
#else
	std::string utf8 = convertWStringToUtf8(strFilename);
	struct stat stFileInfo;
	int intStat = stat(utf8.c_str(),&stFileInfo);
#endif

	return intStat == 0;
}